

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O3

void cfl_predict_hbd_32x32_ssse3
               (int16_t *pred_buf_q3,uint16_t *dst,int dst_stride,int alpha_q3,int bd)

{
  short sVar1;
  ulong uVar2;
  uint16_t *puVar3;
  undefined1 auVar4 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  short sVar8;
  ushort uVar9;
  short sVar11;
  ushort uVar12;
  short sVar13;
  short sVar14;
  ushort uVar15;
  short sVar16;
  short sVar17;
  ushort uVar18;
  short sVar19;
  short sVar20;
  ushort uVar21;
  short sVar22;
  short sVar23;
  ushort uVar24;
  short sVar25;
  short sVar26;
  ushort uVar27;
  short sVar28;
  short sVar29;
  undefined1 auVar10 [16];
  short sVar30;
  ushort uVar31;
  short sVar32;
  short sVar33;
  undefined1 auVar34 [16];
  
  auVar4 = pshuflw(ZEXT416((uint)alpha_q3),ZEXT416((uint)alpha_q3),0);
  auVar4._4_4_ = auVar4._0_4_;
  auVar4._8_4_ = auVar4._0_4_;
  auVar4._12_4_ = auVar4._0_4_;
  auVar5 = pabsw(in_XMM1,auVar4);
  auVar5 = psllw(auVar5,9);
  auVar6 = pshuflw(ZEXT216(*dst),ZEXT216(*dst),0);
  auVar10._8_4_ = 0xffffffff;
  auVar10._0_8_ = 0xffffffffffffffff;
  auVar10._12_4_ = 0xffffffff;
  auVar7._8_4_ = 0xffffffff;
  auVar7._0_8_ = 0xffffffffffffffff;
  auVar7._12_4_ = 0xffffffff;
  auVar7 = psllw(auVar7,ZEXT416((uint)bd));
  auVar7 = auVar7 ^ auVar10;
  puVar3 = dst + 0x18;
  uVar2 = 0xffffffffffffffc0;
  do {
    auVar10 = *(undefined1 (*) [16])((long)pred_buf_q3 + uVar2 + 0x40);
    auVar34 = psignw(auVar4,auVar10);
    auVar10 = pabsw(auVar10,auVar10);
    auVar10 = pmulhrsw(auVar10,auVar5);
    auVar10 = psignw(auVar10,auVar34);
    sVar29 = auVar6._0_2_;
    sVar8 = auVar10._0_2_ + sVar29;
    sVar33 = auVar6._2_2_;
    sVar11 = auVar10._2_2_ + sVar33;
    sVar14 = auVar10._4_2_ + sVar29;
    sVar17 = auVar10._6_2_ + sVar33;
    sVar20 = auVar10._8_2_ + sVar29;
    sVar23 = auVar10._10_2_ + sVar33;
    sVar26 = auVar10._12_2_ + sVar29;
    sVar30 = auVar10._14_2_ + sVar33;
    sVar1 = auVar7._0_2_;
    uVar9 = (ushort)(sVar1 < sVar8) * sVar1 | (ushort)(sVar1 >= sVar8) * sVar8;
    sVar8 = auVar7._2_2_;
    uVar12 = (ushort)(sVar8 < sVar11) * sVar8 | (ushort)(sVar8 >= sVar11) * sVar11;
    sVar11 = auVar7._4_2_;
    uVar15 = (ushort)(sVar11 < sVar14) * sVar11 | (ushort)(sVar11 >= sVar14) * sVar14;
    sVar14 = auVar7._6_2_;
    uVar18 = (ushort)(sVar14 < sVar17) * sVar14 | (ushort)(sVar14 >= sVar17) * sVar17;
    sVar17 = auVar7._8_2_;
    uVar21 = (ushort)(sVar17 < sVar20) * sVar17 | (ushort)(sVar17 >= sVar20) * sVar20;
    sVar20 = auVar7._10_2_;
    uVar24 = (ushort)(sVar20 < sVar23) * sVar20 | (ushort)(sVar20 >= sVar23) * sVar23;
    sVar23 = auVar7._12_2_;
    uVar27 = (ushort)(sVar23 < sVar26) * sVar23 | (ushort)(sVar23 >= sVar26) * sVar26;
    sVar26 = auVar7._14_2_;
    uVar31 = (ushort)(sVar26 < sVar30) * sVar26 | (ushort)(sVar26 >= sVar30) * sVar30;
    puVar3[-0x18] = (-1 < (short)uVar9) * uVar9;
    puVar3[-0x17] = (-1 < (short)uVar12) * uVar12;
    puVar3[-0x16] = (-1 < (short)uVar15) * uVar15;
    puVar3[-0x15] = (-1 < (short)uVar18) * uVar18;
    puVar3[-0x14] = (-1 < (short)uVar21) * uVar21;
    puVar3[-0x13] = (-1 < (short)uVar24) * uVar24;
    puVar3[-0x12] = (-1 < (short)uVar27) * uVar27;
    puVar3[-0x11] = (-1 < (short)uVar31) * uVar31;
    auVar10 = *(undefined1 (*) [16])((long)pred_buf_q3 + uVar2 + 0x50);
    auVar34 = psignw(auVar4,auVar10);
    auVar10 = pabsw(auVar10,auVar10);
    auVar10 = pmulhrsw(auVar10,auVar5);
    auVar10 = psignw(auVar10,auVar34);
    sVar30 = auVar10._0_2_ + sVar29;
    sVar13 = auVar10._2_2_ + sVar33;
    sVar16 = auVar10._4_2_ + sVar29;
    sVar19 = auVar10._6_2_ + sVar33;
    sVar22 = auVar10._8_2_ + sVar29;
    sVar25 = auVar10._10_2_ + sVar33;
    sVar28 = auVar10._12_2_ + sVar29;
    sVar32 = auVar10._14_2_ + sVar33;
    uVar9 = (ushort)(sVar1 < sVar30) * sVar1 | (ushort)(sVar1 >= sVar30) * sVar30;
    uVar12 = (ushort)(sVar8 < sVar13) * sVar8 | (ushort)(sVar8 >= sVar13) * sVar13;
    uVar15 = (ushort)(sVar11 < sVar16) * sVar11 | (ushort)(sVar11 >= sVar16) * sVar16;
    uVar18 = (ushort)(sVar14 < sVar19) * sVar14 | (ushort)(sVar14 >= sVar19) * sVar19;
    uVar21 = (ushort)(sVar17 < sVar22) * sVar17 | (ushort)(sVar17 >= sVar22) * sVar22;
    uVar24 = (ushort)(sVar20 < sVar25) * sVar20 | (ushort)(sVar20 >= sVar25) * sVar25;
    uVar27 = (ushort)(sVar23 < sVar28) * sVar23 | (ushort)(sVar23 >= sVar28) * sVar28;
    uVar31 = (ushort)(sVar26 < sVar32) * sVar26 | (ushort)(sVar26 >= sVar32) * sVar32;
    puVar3[-0x10] = (-1 < (short)uVar9) * uVar9;
    puVar3[-0xf] = (-1 < (short)uVar12) * uVar12;
    puVar3[-0xe] = (-1 < (short)uVar15) * uVar15;
    puVar3[-0xd] = (-1 < (short)uVar18) * uVar18;
    puVar3[-0xc] = (-1 < (short)uVar21) * uVar21;
    puVar3[-0xb] = (-1 < (short)uVar24) * uVar24;
    puVar3[-10] = (-1 < (short)uVar27) * uVar27;
    puVar3[-9] = (-1 < (short)uVar31) * uVar31;
    auVar10 = *(undefined1 (*) [16])((long)pred_buf_q3 + uVar2 + 0x60);
    auVar34 = psignw(auVar4,auVar10);
    auVar10 = pabsw(auVar10,auVar10);
    auVar10 = pmulhrsw(auVar10,auVar5);
    auVar10 = psignw(auVar10,auVar34);
    sVar30 = auVar10._0_2_ + sVar29;
    sVar13 = auVar10._2_2_ + sVar33;
    sVar16 = auVar10._4_2_ + sVar29;
    sVar19 = auVar10._6_2_ + sVar33;
    sVar22 = auVar10._8_2_ + sVar29;
    sVar25 = auVar10._10_2_ + sVar33;
    sVar28 = auVar10._12_2_ + sVar29;
    sVar32 = auVar10._14_2_ + sVar33;
    uVar9 = (ushort)(sVar1 < sVar30) * sVar1 | (ushort)(sVar1 >= sVar30) * sVar30;
    uVar12 = (ushort)(sVar8 < sVar13) * sVar8 | (ushort)(sVar8 >= sVar13) * sVar13;
    uVar15 = (ushort)(sVar11 < sVar16) * sVar11 | (ushort)(sVar11 >= sVar16) * sVar16;
    uVar18 = (ushort)(sVar14 < sVar19) * sVar14 | (ushort)(sVar14 >= sVar19) * sVar19;
    uVar21 = (ushort)(sVar17 < sVar22) * sVar17 | (ushort)(sVar17 >= sVar22) * sVar22;
    uVar24 = (ushort)(sVar20 < sVar25) * sVar20 | (ushort)(sVar20 >= sVar25) * sVar25;
    uVar27 = (ushort)(sVar23 < sVar28) * sVar23 | (ushort)(sVar23 >= sVar28) * sVar28;
    uVar31 = (ushort)(sVar26 < sVar32) * sVar26 | (ushort)(sVar26 >= sVar32) * sVar32;
    puVar3[-8] = (-1 < (short)uVar9) * uVar9;
    puVar3[-7] = (-1 < (short)uVar12) * uVar12;
    puVar3[-6] = (-1 < (short)uVar15) * uVar15;
    puVar3[-5] = (-1 < (short)uVar18) * uVar18;
    puVar3[-4] = (-1 < (short)uVar21) * uVar21;
    puVar3[-3] = (-1 < (short)uVar24) * uVar24;
    puVar3[-2] = (-1 < (short)uVar27) * uVar27;
    puVar3[-1] = (-1 < (short)uVar31) * uVar31;
    auVar10 = *(undefined1 (*) [16])((long)pred_buf_q3 + uVar2 + 0x70);
    auVar34 = psignw(auVar4,auVar10);
    auVar10 = pabsw(auVar10,auVar10);
    auVar10 = pmulhrsw(auVar10,auVar5);
    auVar10 = psignw(auVar10,auVar34);
    sVar30 = auVar10._0_2_ + sVar29;
    sVar13 = auVar10._2_2_ + sVar33;
    sVar16 = auVar10._4_2_ + sVar29;
    sVar19 = auVar10._6_2_ + sVar33;
    sVar22 = auVar10._8_2_ + sVar29;
    sVar25 = auVar10._10_2_ + sVar33;
    sVar29 = auVar10._12_2_ + sVar29;
    sVar33 = auVar10._14_2_ + sVar33;
    uVar9 = (ushort)(sVar1 < sVar30) * sVar1 | (ushort)(sVar1 >= sVar30) * sVar30;
    uVar12 = (ushort)(sVar8 < sVar13) * sVar8 | (ushort)(sVar8 >= sVar13) * sVar13;
    uVar15 = (ushort)(sVar11 < sVar16) * sVar11 | (ushort)(sVar11 >= sVar16) * sVar16;
    uVar18 = (ushort)(sVar14 < sVar19) * sVar14 | (ushort)(sVar14 >= sVar19) * sVar19;
    uVar21 = (ushort)(sVar17 < sVar22) * sVar17 | (ushort)(sVar17 >= sVar22) * sVar22;
    uVar24 = (ushort)(sVar20 < sVar25) * sVar20 | (ushort)(sVar20 >= sVar25) * sVar25;
    uVar27 = (ushort)(sVar23 < sVar29) * sVar23 | (ushort)(sVar23 >= sVar29) * sVar29;
    uVar31 = (ushort)(sVar26 < sVar33) * sVar26 | (ushort)(sVar26 >= sVar33) * sVar33;
    *puVar3 = (-1 < (short)uVar9) * uVar9;
    puVar3[1] = (-1 < (short)uVar12) * uVar12;
    puVar3[2] = (-1 < (short)uVar15) * uVar15;
    puVar3[3] = (-1 < (short)uVar18) * uVar18;
    puVar3[4] = (-1 < (short)uVar21) * uVar21;
    puVar3[5] = (-1 < (short)uVar24) * uVar24;
    puVar3[6] = (-1 < (short)uVar27) * uVar27;
    puVar3[7] = (-1 < (short)uVar31) * uVar31;
    uVar2 = uVar2 + 0x40;
    puVar3 = puVar3 + dst_stride;
  } while (uVar2 < 0x7c0);
  return;
}

Assistant:

static inline void cfl_predict_hbd_ssse3(const int16_t *pred_buf_q3,
                                         uint16_t *dst, int dst_stride,
                                         int alpha_q3, int bd, int width,
                                         int height) {
  const __m128i alpha_sign = _mm_set1_epi16(alpha_q3);
  const __m128i alpha_q12 = _mm_slli_epi16(_mm_abs_epi16(alpha_sign), 9);
  const __m128i dc_q0 = _mm_set1_epi16(*dst);
  const __m128i max = highbd_max_epi16(bd);
  const __m128i zeros = _mm_setzero_si128();
  __m128i *row = (__m128i *)pred_buf_q3;
  const __m128i *row_end = row + height * CFL_BUF_LINE_I128;
  do {
    __m128i res = predict_unclipped(row, alpha_q12, alpha_sign, dc_q0);
    res = highbd_clamp_epi16(res, zeros, max);
    if (width == 4) {
      _mm_storel_epi64((__m128i *)dst, res);
    } else {
      _mm_storeu_si128((__m128i *)dst, res);
    }
    if (width >= 16) {
      const __m128i res_1 =
          predict_unclipped(row + 1, alpha_q12, alpha_sign, dc_q0);
      _mm_storeu_si128(((__m128i *)dst) + 1,
                       highbd_clamp_epi16(res_1, zeros, max));
    }
    if (width == 32) {
      const __m128i res_2 =
          predict_unclipped(row + 2, alpha_q12, alpha_sign, dc_q0);
      _mm_storeu_si128((__m128i *)(dst + 16),
                       highbd_clamp_epi16(res_2, zeros, max));
      const __m128i res_3 =
          predict_unclipped(row + 3, alpha_q12, alpha_sign, dc_q0);
      _mm_storeu_si128((__m128i *)(dst + 24),
                       highbd_clamp_epi16(res_3, zeros, max));
    }
    dst += dst_stride;
  } while ((row += CFL_BUF_LINE_I128) < row_end);
}